

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O2

UnicodeString * icu_63::ICUServiceKey::parseSuffix(UnicodeString *result)

{
  int32_t iVar1;
  
  iVar1 = UnicodeString::indexOf(result,L'/');
  if (-1 < iVar1) {
    UnicodeString::remove(result,(char *)0x0);
  }
  return result;
}

Assistant:

UnicodeString& 
ICUServiceKey::parseSuffix(UnicodeString& result) 
{
    int32_t n = result.indexOf(PREFIX_DELIMITER);
    if (n >= 0) {
        result.remove(0, n+1);
    }
    return result;
}